

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O2

int CorrelCompare(char *key1,char *key2)

{
  if (*(long *)key1 != *(long *)key2) {
    return 1;
  }
  return (int)(*(long *)(key1 + 8) != *(long *)(key2 + 8));
}

Assistant:

static int
CorrelCompare(
  const char * key1,
  const char * key2)
{
    HashEntry *entry1;
    HashEntry *entry2;

    entry1 = (HashEntry *) key1;
    entry2 = (HashEntry *) key2;
    if (entry1->f != entry2->f || entry1->g != entry2->g) return(1);

    return(0);

}